

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall gdsSREF::reset(gdsSREF *this)

{
  std::__cxx11::string::assign((char *)&this->name);
  (this->sref_flags).super__Base_bitset<1UL>._M_w = 0;
  this->reflection = false;
  this->scale = 1.0;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  std::__cxx11::string::assign((char *)&this->propvalue);
  return;
}

Assistant:

void gdsSREF::reset()
{
  name = "\0";
  sref_flags.reset();
  reflection = false;
  angle = 0;
  scale = 1;
  xCor = 0;
  yCor = 0;
  propattr = 0;
  propvalue = "\0";
}